

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::geometry::anon_unknown_0::VaryingOutputCountCase::createInstance
          (VaryingOutputCountCase *this,Context *context)

{
  VaryingOutputCountTestInstance *this_00;
  char *name;
  Context *context_local;
  VaryingOutputCountCase *this_local;
  
  this_00 = (VaryingOutputCountTestInstance *)operator_new(0x170);
  name = tcu::TestNode::getName((TestNode *)this);
  VaryingOutputCountTestInstance::VaryingOutputCountTestInstance
            (this_00,context,name,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,this->m_test,this->m_mode);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* VaryingOutputCountCase::createInstance (Context& context) const
{
	return new VaryingOutputCountTestInstance (context, getName(), VK_PRIMITIVE_TOPOLOGY_POINT_LIST, m_test, m_mode);
}